

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_data_priority_add_child(Curl_easy *parent,Curl_easy *child,_Bool exclusive)

{
  undefined1 *puVar1;
  Curl_easy *pCVar2;
  Curl_data_prio_node *pCVar3;
  Curl_data_prio_node **ppCVar4;
  Curl_data_prio_node *pCVar5;
  Curl_data_prio_node *pCVar6;
  Curl_data_prio_node *pCVar7;
  Curl_data_prio_node *pCVar8;
  
  pCVar2 = (child->set).priority.parent;
  if (pCVar2 != (Curl_easy *)0x0) {
    pCVar5 = (Curl_data_prio_node *)&(pCVar2->set).priority.children;
    do {
      pCVar6 = pCVar5;
      pCVar5 = pCVar6->next;
      if (pCVar5 == (Curl_data_prio_node *)0x0) goto LAB_005c8ba1;
    } while (pCVar5->data != child);
    pCVar6->next = pCVar5->next;
    (*Curl_cfree)(pCVar5);
LAB_005c8ba1:
    (child->set).priority.parent = (Curl_easy *)0x0;
    puVar1 = &(child->set).priority.field_0x14;
    *puVar1 = *puVar1 & 0xfe;
  }
  if (parent != (Curl_easy *)0x0) {
    pCVar5 = (Curl_data_prio_node *)(*Curl_ccalloc)(1,0x10);
    if (pCVar5 == (Curl_data_prio_node *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pCVar5->data = child;
    pCVar6 = (Curl_data_prio_node *)&(parent->set).priority.children;
    pCVar3 = (parent->set).priority.children;
    pCVar7 = pCVar3;
    if (exclusive && pCVar3 != (Curl_data_prio_node *)0x0) {
      do {
        (pCVar7->data->set).priority.parent = child;
        ppCVar4 = &pCVar7->next;
        pCVar7 = *ppCVar4;
      } while (*ppCVar4 != (Curl_data_prio_node *)0x0);
      pCVar7 = (Curl_data_prio_node *)&(child->set).priority.children;
      do {
        pCVar8 = pCVar7;
        pCVar7 = pCVar8->next;
      } while (pCVar7 != (Curl_data_prio_node *)0x0);
      pCVar8->next = pCVar3;
      *(Curl_data_prio_node **)pCVar6 = (Curl_data_prio_node *)0x0;
    }
    for (; pCVar6->next != (Curl_data_prio_node *)0x0; pCVar6 = pCVar6->next) {
      puVar1 = &(pCVar6->next->data->set).priority.field_0x14;
      *puVar1 = *puVar1 & 0xfe;
    }
    pCVar6->next = pCVar5;
    if (pCVar5 == (Curl_data_prio_node *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  (child->set).priority.parent = parent;
  (child->set).priority.field_0x14 = (child->set).priority.field_0x14 & 0xfe | exclusive;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_data_priority_add_child(struct Curl_easy *parent,
                                      struct Curl_easy *child,
                                      bool exclusive)
{
  if(child->set.priority.parent) {
    priority_remove_child(child->set.priority.parent, child);
  }

  if(parent) {
    struct Curl_data_prio_node **tail;
    struct Curl_data_prio_node *pnode;

    pnode = calloc(1, sizeof(*pnode));
    if(!pnode)
      return CURLE_OUT_OF_MEMORY;
    pnode->data = child;

    if(parent->set.priority.children && exclusive) {
      /* exclusive: move all existing children underneath the new child */
      struct Curl_data_prio_node *node = parent->set.priority.children;
      while(node) {
        node->data->set.priority.parent = child;
        node = node->next;
      }

      tail = &child->set.priority.children;
      while(*tail)
        tail = &(*tail)->next;

      DEBUGASSERT(!*tail);
      *tail = parent->set.priority.children;
      parent->set.priority.children = 0;
    }

    tail = &parent->set.priority.children;
    while(*tail) {
      (*tail)->data->set.priority.exclusive = FALSE;
      tail = &(*tail)->next;
    }

    DEBUGASSERT(!*tail);
    *tail = pnode;
  }

  child->set.priority.parent = parent;
  child->set.priority.exclusive = exclusive;
  return CURLE_OK;
}